

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O2

void QtSharedPointer::internalSafetyCheckRemove(void *d_ptr)

{
  Entry *pEVar1;
  byte bVar2;
  byte bVar3;
  Data *this;
  Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *d;
  Span *pSVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uchar uVar9;
  Type *this_00;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *in_RDI;
  Span *pSVar15;
  long in_FS_OFFSET;
  Bucket BVar16;
  const_iterator it;
  QMessageLogger local_80;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_60;
  Bucket local_58;
  undefined1 local_48 [16];
  long local_38;
  ulong uVar14;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = in_RDI;
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>::
            operator()(in_RDI);
  if (this_00 == (Type *)0x0) {
LAB_0034aa9f:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = this_00;
  QBasicMutex::lock((QBasicMutex *)this_00);
  local_48[8] = true;
  this = (this_00->dPointers).d;
  if ((this != (Data *)0x0) && (this->size != 0)) {
    BVar16 = QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
             findBucket<void_const*>
                       ((Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)this,
                        &local_60);
    if ((BVar16.span)->offsets[BVar16.index] != 0xff) {
      pSVar15 = ((this_00->dPointers).d)->spans;
      uVar10 = (((long)BVar16.span - (long)pSVar15) / 0x90 << 7 | BVar16.index) >> 7;
      uVar13 = (uint)BVar16.index & 0x7f;
      uVar14 = (ulong)uVar13;
      it = QHash<void_const_volatile*,void_const*>::constFindImpl<void_const_volatile*>
                     ((QHash<void_const_volatile*,void_const*> *)&this_00->dataPointers,
                      (void **)(pSVar15[uVar10].entries[pSVar15[uVar10].offsets[uVar14]].storage.
                                data + 8));
      QHash<const_volatile_void_*,_const_void_*>::erase(&this_00->dataPointers,it);
      QHash<const_void_*,_(anonymous_namespace)::Data>::detach(&this_00->dPointers);
      d = (this_00->dPointers).d;
      pSVar4 = d->spans;
      pSVar15 = pSVar4 + uVar10;
      bVar2 = pSVar15->offsets[uVar14];
      pSVar15->offsets[uVar14] = 0xff;
      pSVar4[uVar10].entries[bVar2].storage.data[0] = pSVar4[uVar10].nextFree;
      pSVar4[uVar10].nextFree = bVar2;
      d->size = d->size - 1;
      local_80.context.file._4_4_ = 0;
      local_80.context.file._0_4_ = uVar13;
      local_80.context._0_8_ = pSVar15;
LAB_0034a96f:
      QHashPrivate::Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::
      advanceWrapped((Bucket *)&local_80,d);
      uVar8 = local_80.context._0_8_;
      uVar10 = CONCAT44(local_80.context.file._4_4_,(uint)local_80.context.file);
      if (((uchar *)local_80.context._0_8_)[uVar10] != 0xff) {
        sVar11 = QHashPrivate::calculateHash<void_const*>
                           ((void **)(*(Entry **)(local_80.context._0_8_ + 0x80) +
                                     ((uchar *)local_80.context._0_8_)[uVar10]),d->seed);
        uVar12 = d->numBuckets - 1 & sVar11;
        local_58.span = d->spans + (uVar12 >> 7);
        local_58.index = (size_t)((uint)uVar12 & 0x7f);
        while( true ) {
          if ((local_58.span == (Span *)uVar8) && (local_58.index == uVar10)) goto LAB_0034a96f;
          if ((local_58.span == pSVar15) && (local_58.index == uVar14)) break;
          QHashPrivate::Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket
          ::advanceWrapped(&local_58,d);
        }
        if ((Span *)uVar8 == pSVar15) {
          pSVar15->offsets[uVar14] = pSVar15->offsets[uVar10];
          pSVar15->offsets[uVar10] = 0xff;
          pSVar15 = (Span *)local_80.context._0_8_;
        }
        else {
          uVar9 = pSVar15->nextFree;
          if (uVar9 == pSVar15->allocated) {
            QHashPrivate::Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::
            addStorage(pSVar15);
            uVar9 = pSVar15->nextFree;
          }
          pSVar15->offsets[uVar14] = uVar9;
          pEVar5 = pSVar15->entries;
          bVar2 = pSVar15->nextFree;
          pSVar15->nextFree = pEVar5[bVar2].storage.data[0];
          bVar3 = ((uchar *)uVar8)[uVar10];
          ((uchar *)uVar8)[uVar10] = 0xff;
          pEVar6 = *(Entry **)(uVar8 + 0x80);
          pEVar1 = pEVar6 + bVar3;
          uVar7 = *(undefined8 *)((pEVar1->storage).data + 8);
          pEVar5 = pEVar5 + bVar2;
          *(undefined8 *)(pEVar5->storage).data = *(undefined8 *)(pEVar1->storage).data;
          *(undefined8 *)((pEVar5->storage).data + 8) = uVar7;
          pEVar6[bVar3].storage.data[0] = *(uchar *)(uVar8 + 0x89);
          *(byte *)(uVar8 + 0x89) = bVar3;
          pSVar15 = (Span *)local_80.context._0_8_;
        }
        uVar14 = CONCAT44(local_80.context.file._4_4_,(uint)local_80.context.file);
        local_80.context._0_8_ = pSVar15;
        goto LAB_0034a96f;
      }
      QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
      goto LAB_0034aa9f;
    }
  }
  local_80.context.version = 2;
  local_80.context.function._4_4_ = 0;
  local_80.context.line = 0;
  local_80.context.file._0_4_ = 0;
  local_80.context.file._4_4_ = 0;
  local_80.context.function._0_4_ = 0;
  local_80.context.category = "default";
  QMessageLogger::fatal
            (&local_80,
             "QSharedPointer: internal self-check inconsistency: pointer %p was not tracked. To use QT_SHAREDPOINTER_TRACK_POINTERS, you have to enable it throughout in your code."
             ,local_60);
}

Assistant:

void QtSharedPointer::internalSafetyCheckRemove(const void *d_ptr)
{
    KnownPointers *const kp = knownPointers();
    if (!kp)
        return;                 // end-game: the application is being destroyed already

    QMutexLocker lock(&kp->mutex);

    const auto it = kp->dPointers.constFind(d_ptr);
    if (Q_UNLIKELY(it == kp->dPointers.cend())) {
        qFatal("QSharedPointer: internal self-check inconsistency: pointer %p was not tracked. "
               "To use QT_SHAREDPOINTER_TRACK_POINTERS, you have to enable it throughout "
               "in your code.", d_ptr);
    }

    const auto it2 = kp->dataPointers.constFind(it->pointer);
    Q_ASSERT(it2 != kp->dataPointers.cend());

    //qDebug("Removing d=%p value=%p", d_ptr, it->pointer);

    // remove entries
    kp->dataPointers.erase(it2);
    kp->dPointers.erase(it);
    Q_ASSERT(kp->dPointers.size() == kp->dataPointers.size());
}